

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.cpp
# Opt level: O3

void __thiscall glslang::TPpContext::~TPpContext(TPpContext *this)

{
  ~TPpContext(this);
  operator_delete(this,0x3d0);
  return;
}

Assistant:

TPpContext::~TPpContext()
{
    delete [] preamble;

    // free up the inputStack
    while (! inputStack.empty())
        popInput();
}